

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::TestPreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>::
Bind<cmCMakePresetsGraph::TestPreset,std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>,std::function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraph::TestPreset> *this,string_view *name,
          offset_in_TestPreset_to_optional<cmCMakePresetsGraph::TestPreset::FilterOptions> member,
          function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
          *func,bool required)

{
  Object<cmCMakePresetsGraph::TestPreset> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
  *pfStack_28;
  bool required_local;
  function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
  *func_local;
  offset_in_TestPreset_to_optional<cmCMakePresetsGraph::TestPreset::FilterOptions> member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::TestPreset> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)member;
  member_local = (offset_in_TestPreset_to_optional<cmCMakePresetsGraph::TestPreset::FilterOptions>)
                 name;
  name_local = (string_view *)this;
  std::
  function<bool_(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_78.func,func);
  local_78.member =
       (offset_in_TestPreset_to_optional<cmCMakePresetsGraph::TestPreset::FilterOptions>)func_local;
  std::function<bool(cmCMakePresetsGraph::TestPreset&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset>::Bind<cmCMakePresetsGraph::TestPreset,std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>,std::function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>cmCMakePresetsGraph::TestPreset::*,std::function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>,bool)::_lambda(cmCMakePresetsGraph::TestPreset&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCMakePresetsGraph::TestPreset&,Json::Value_const*,cmJSONState*)> *)
             &local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::function<bool_(cmCMakePresetsGraph::TestPreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  ~function(&local_50);
  Bind<cmCMakePresetsGraph::TestPreset,std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>,std::function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>cmCMakePresetsGraph::TestPreset::*,std::function<bool(std::optional<cmCMakePresetsGraph::TestPreset::FilterOptions>&,Json::Value_const*,cmJSONState*)>,bool)
  ::{lambda(cmCMakePresetsGraph::TestPreset&,Json::Value_const*,cmJSONState*)#1}::~basic_string_view
            ((_lambda_cmCMakePresetsGraph__TestPreset__Json__Value_const__cmJSONState___1_ *)
             &local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }